

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderNaive.cpp
# Opt level: O2

StepStatus __thiscall
adios2::core::engine::ssc::SscReaderNaive::BeginStep
          (SscReaderNaive *this,StepMode stepMode,float timeoutSeconds,bool readerLocked)

{
  Buffer *this_00;
  int64_t *piVar1;
  byte bVar2;
  int iVar3;
  uint8_t *puVar4;
  StepStatus SVar5;
  void *__src;
  ulong uVar6;
  mapped_type *this_01;
  Variable *pVVar7;
  pointer __src_00;
  size_t __n;
  ulong uVar8;
  vector<char,_std::allocator<char>_> value;
  int globalSize;
  allocator local_1e4;
  allocator local_1e3;
  allocator local_1e2;
  allocator local_1e1;
  uint64_t pos;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
  *local_1d8;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  string local_198 [32];
  BlockInfo b;
  string local_70 [32];
  string local_50 [32];
  
  this_00 = &(this->super_SscReaderBase).m_Buffer;
  Buffer::clear(this_00);
  local_1d0 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)&this->m_BlockMap;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)local_1d0);
  piVar1 = &(this->super_SscReaderBase).m_CurrentStep;
  *piVar1 = *piVar1 + 1;
  if ((this->super_SscReaderBase).m_ReaderRank == 0) {
    MPI_Recv(&globalSize,1,&ompi_mpi_int,(this->super_SscReaderBase).m_WriterMasterStreamRank,0,
             (this->super_SscReaderBase).m_StreamComm,0);
    Buffer::resize(this_00,(long)globalSize);
    iVar3 = globalSize;
    __src = malloc((long)globalSize);
    MPI_Recv(__src,iVar3,&ompi_mpi_char,(this->super_SscReaderBase).m_WriterMasterStreamRank,0,
             (this->super_SscReaderBase).m_StreamComm,0);
    memcpy((this->super_SscReaderBase).m_Buffer.m_Buffer,__src,(long)globalSize);
    free(__src);
  }
  MPI_Bcast(&globalSize,1,&ompi_mpi_int,0,(this->super_SscReaderBase).m_ReaderComm);
  if ((this->super_SscReaderBase).m_ReaderRank != 0) {
    Buffer::resize(this_00,(long)globalSize);
  }
  if (globalSize == 1) {
    SVar5 = EndOfStream;
  }
  else {
    MPI_Bcast((this->super_SscReaderBase).m_Buffer.m_Buffer,globalSize,&ompi_mpi_char,0,
              (this->super_SscReaderBase).m_ReaderComm);
    local_1d8 = &(this->super_SscReaderBase).m_StructDefinitions;
    uVar6 = 0;
LAB_00156a4b:
    if (uVar6 < (this->super_SscReaderBase).m_Buffer.m_Size) {
      puVar4 = (this->super_SscReaderBase).m_Buffer.m_Buffer;
      local_1c8 = *(long *)(puVar4 + uVar6) + uVar6;
      pos = *(long *)(puVar4 + uVar6 + 8) + uVar6;
      uVar8 = local_1c8;
      local_1c0 = uVar6;
LAB_00156a7d:
      while (uVar6 = pos, pos < uVar8) {
        bVar2 = (this->super_SscReaderBase).m_Buffer.m_Buffer[pos];
        if (bVar2 == 0x42) goto LAB_00156abe;
        if (bVar2 == 0x41) {
          pos = pos + 1;
          DeserializeStructDefinitions(this_00,&pos,(this->super_SscReaderBase).m_IO,true,local_1d8)
          ;
        }
        else {
          pos = pos + 5;
          b.name._M_string_length = 0;
          b.name.field_2._M_local_buf[0] = '\0';
          b.structDef._M_dataplus._M_p = (pointer)&b.structDef.field_2;
          b.structDef._M_string_length = 0;
          b.structDef.field_2._M_local_buf[0] = '\0';
          b.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          b.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          b.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          b.memCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          b.memCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          b.memStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          b.memStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          b.count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          b.memStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          b.count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          b.count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          b.start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          b.start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          b.shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          b.start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          b.shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          b.shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          b.memCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          b.name._M_dataplus._M_p = (pointer)&b.name.field_2;
          DeserializeVariable(this_00,(uint)bVar2,&pos,&b,(this->super_SscReaderBase).m_IO,true,
                              local_1d8);
          b.bufferStart = b.bufferStart + local_1c0;
          this_01 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_1d0,&b.name);
          std::
          vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
          ::push_back(this_01,&b);
          if ((b.shapeId != LocalValue) && (b.shapeId != GlobalValue)) goto LAB_00157087;
          std::vector<char,_std::allocator<char>_>::vector
                    (&value,b.bufferCount,(allocator_type *)local_1b8);
          memcpy(value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 b.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (long)b.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)b.value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
          switch(b.type) {
          case Int8:
            pVVar7 = adios2::core::IO::InquireVariable<signed_char>
                               ((string *)(this->super_SscReaderBase).m_IO);
            goto LAB_00156cbf;
          case Int16:
            pVVar7 = adios2::core::IO::InquireVariable<short>
                               ((string *)(this->super_SscReaderBase).m_IO);
            goto LAB_00156eb1;
          case Int32:
            pVVar7 = adios2::core::IO::InquireVariable<int>
                               ((string *)(this->super_SscReaderBase).m_IO);
            goto LAB_00157021;
          case Int64:
            pVVar7 = adios2::core::IO::InquireVariable<long>
                               ((string *)(this->super_SscReaderBase).m_IO);
            goto LAB_00156e4d;
          case UInt8:
            pVVar7 = adios2::core::IO::InquireVariable<unsigned_char>
                               ((string *)(this->super_SscReaderBase).m_IO);
LAB_00156cbf:
            __src_00 = value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            if (pVVar7 == (Variable *)0x0) break;
            __n = (long)value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start;
            memcpy(pVVar7 + 0x228,
                   value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,__n);
            memcpy(pVVar7 + 0x229,__src_00,__n);
            pVVar7 = pVVar7 + 0x22a;
            goto LAB_00157070;
          case UInt16:
            pVVar7 = adios2::core::IO::InquireVariable<unsigned_short>
                               ((string *)(this->super_SscReaderBase).m_IO);
LAB_00156eb1:
            __src_00 = value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            if (pVVar7 == (Variable *)0x0) break;
            __n = (long)value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start;
            memcpy(pVVar7 + 0x228,
                   value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,__n);
            memcpy(pVVar7 + 0x22a,__src_00,__n);
            pVVar7 = pVVar7 + 0x22c;
            goto LAB_00157070;
          case UInt32:
            pVVar7 = adios2::core::IO::InquireVariable<unsigned_int>
                               ((string *)(this->super_SscReaderBase).m_IO);
            goto LAB_00157021;
          case UInt64:
            pVVar7 = adios2::core::IO::InquireVariable<unsigned_long>
                               ((string *)(this->super_SscReaderBase).m_IO);
            goto LAB_00156e4d;
          case Float:
            pVVar7 = adios2::core::IO::InquireVariable<float>
                               ((string *)(this->super_SscReaderBase).m_IO);
LAB_00157021:
            __src_00 = value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            if (pVVar7 == (Variable *)0x0) break;
            __n = (long)value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start;
            memcpy(pVVar7 + 0x228,
                   value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,__n);
            memcpy(pVVar7 + 0x22c,__src_00,__n);
            pVVar7 = pVVar7 + 0x230;
            goto LAB_00157070;
          case Double:
            pVVar7 = adios2::core::IO::InquireVariable<double>
                               ((string *)(this->super_SscReaderBase).m_IO);
            goto LAB_00156e4d;
          case LongDouble:
            pVVar7 = adios2::core::IO::InquireVariable<long_double>
                               ((string *)(this->super_SscReaderBase).m_IO);
            __src_00 = value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            if (pVVar7 == (Variable *)0x0) break;
            __n = (long)value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start;
            memcpy(pVVar7 + 0x230,
                   value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,__n);
            memcpy(pVVar7 + 0x240,__src_00,__n);
            pVVar7 = pVVar7 + 0x250;
            goto LAB_00157070;
          case FloatComplex:
            pVVar7 = adios2::core::IO::InquireVariable<std::complex<float>>
                               ((string *)(this->super_SscReaderBase).m_IO);
LAB_00156e4d:
            __src_00 = value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            if (pVVar7 != (Variable *)0x0) {
              __n = (long)value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start;
              memcpy(pVVar7 + 0x228,
                     value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,__n);
              memcpy(pVVar7 + 0x230,__src_00,__n);
              pVVar7 = pVVar7 + 0x238;
LAB_00157070:
              memcpy(pVVar7,__src_00,__n);
            }
            break;
          case DoubleComplex:
            pVVar7 = adios2::core::IO::InquireVariable<std::complex<double>>
                               ((string *)(this->super_SscReaderBase).m_IO);
            __src_00 = value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            if (pVVar7 != (Variable *)0x0) {
              __n = (long)value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start;
              memcpy(pVVar7 + 0x228,
                     value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,__n);
              memcpy(pVVar7 + 0x238,__src_00,__n);
              pVVar7 = pVVar7 + 0x248;
              goto LAB_00157070;
            }
            break;
          case String:
            pVVar7 = adios2::core::IO::InquireVariable<std::__cxx11::string>
                               ((string *)(this->super_SscReaderBase).m_IO);
            if (pVVar7 != (Variable *)0x0) {
              local_1b8[0] = local_1a8;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                        ((string *)local_1b8,
                         value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish);
              std::__cxx11::string::operator=((string *)(pVVar7 + 0x268),(string *)local_1b8);
              std::__cxx11::string::~string((string *)local_1b8);
              local_1b8[0] = local_1a8;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                        ((string *)local_1b8,
                         value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish);
              std::__cxx11::string::operator=((string *)(pVVar7 + 0x228),(string *)local_1b8);
              std::__cxx11::string::~string((string *)local_1b8);
              local_1b8[0] = local_1a8;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                        ((string *)local_1b8,
                         value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish);
              std::__cxx11::string::operator=((string *)(pVVar7 + 0x248),(string *)local_1b8);
              goto LAB_00156fa7;
            }
            break;
          case Char:
            pVVar7 = adios2::core::IO::InquireVariable<char>
                               ((string *)(this->super_SscReaderBase).m_IO);
            __src_00 = value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            if (pVVar7 != (Variable *)0x0) {
              __n = (long)value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start;
              memcpy(pVVar7 + 0x228,
                     value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,__n);
              memcpy(pVVar7 + 0x229,__src_00,__n);
              pVVar7 = pVVar7 + 0x22a;
              goto LAB_00157070;
            }
            break;
          default:
            std::__cxx11::string::string((string *)local_1b8,"Engine",&local_1e1);
            std::__cxx11::string::string(local_50,"SscReaderNaive",&local_1e2);
            std::__cxx11::string::string(local_198,"BeginStep",&local_1e3);
            std::__cxx11::string::string(local_70,"unknown data type",&local_1e4);
            iVar3 = (this->super_SscReaderBase).m_ReaderRank;
            adios2::helper::Log((string *)local_1b8,local_50,local_198,local_70,iVar3,iVar3,0,
                                (this->super_SscReaderBase).m_Verbosity,FATALERROR);
            std::__cxx11::string::~string(local_70);
            std::__cxx11::string::~string(local_198);
            std::__cxx11::string::~string(local_50);
LAB_00156fa7:
            std::__cxx11::string::~string((string *)local_1b8);
          }
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    (&value.super__Vector_base<char,_std::allocator<char>_>);
LAB_00157087:
          BlockInfo::~BlockInfo(&b);
          uVar8 = local_1c8;
        }
      }
      goto LAB_00156a4b;
    }
    SVar5 = OK;
  }
  return SVar5;
LAB_00156abe:
  pos = pos + 1;
  DeserializeAttribute(this_00,&pos,(this->super_SscReaderBase).m_IO,true);
  goto LAB_00156a7d;
}

Assistant:

StepStatus SscReaderNaive::BeginStep(const StepMode stepMode, const float timeoutSeconds,
                                     const bool readerLocked)
{

    m_Buffer.clear();
    m_BlockMap.clear();

    ++m_CurrentStep;

    int globalSize;

    if (m_ReaderRank == 0)
    {
        MPI_Recv(&globalSize, 1, MPI_INT, m_WriterMasterStreamRank, 0, m_StreamComm,
                 MPI_STATUS_IGNORE);
        m_Buffer.resize(globalSize);
        //        MPI_Recv(m_Buffer.data(), globalSize, MPI_CHAR,
        //        m_WriterMasterStreamRank, 0, m_StreamComm, MPI_STATUS_IGNORE);
        // TODO: revert when the crusher MPI bug is fixed
        ssc::Buffer tmp(globalSize);
        MPI_Recv(tmp.data(), globalSize, MPI_CHAR, m_WriterMasterStreamRank, 0, m_StreamComm,
                 MPI_STATUS_IGNORE);
        std::memcpy(m_Buffer.data(), tmp.data(), globalSize);
    }

    MPI_Bcast(&globalSize, 1, MPI_INT, 0, m_ReaderComm);
    if (m_ReaderRank != 0)
    {
        m_Buffer.resize(globalSize);
    }
    if (globalSize == 1)
    {
        return StepStatus::EndOfStream;
    }
    MPI_Bcast(m_Buffer.data(), globalSize, MPI_CHAR, 0, m_ReaderComm);

    uint64_t pos = 0;
    while (pos < m_Buffer.size())
    {
        uint64_t start = pos;
        uint64_t end = pos + m_Buffer.value<uint64_t>(pos);
        pos += m_Buffer.value<uint64_t>(pos + 8);

        while (pos < end)
        {
            uint8_t shapeId = m_Buffer[pos];
            ++pos;

            if (shapeId == 65)
            {
                DeserializeStructDefinitions(m_Buffer, pos, m_IO, true, m_StructDefinitions);
            }
            else if (shapeId == 66)
            {
                DeserializeAttribute(m_Buffer, pos, m_IO, true);
            }
            else
            {
                pos += 4;
                ssc::BlockInfo b;
                DeserializeVariable(m_Buffer, static_cast<ShapeID>(shapeId), pos, b, m_IO, true,
                                    m_StructDefinitions);
                b.bufferStart += start;
                m_BlockMap[b.name].push_back(b);
                if (b.shapeId == ShapeID::GlobalValue || b.shapeId == ShapeID::LocalValue)
                {
                    std::vector<char> value(b.bufferCount);
                    std::memcpy(value.data(), b.value.data(), b.value.size());

                    if (b.type == DataType::String)
                    {
                        auto variable = m_IO.InquireVariable<std::string>(b.name);
                        if (variable)
                        {
                            variable->m_Value = std::string(value.begin(), value.end());
                            variable->m_Min = std::string(value.begin(), value.end());
                            variable->m_Max = std::string(value.begin(), value.end());
                        }
                    }
#define declare_type(T)                                                                            \
    else if (b.type == helper::GetDataType<T>())                                                   \
    {                                                                                              \
        auto variable = m_IO.InquireVariable<T>(b.name);                                           \
        if (variable)                                                                              \
        {                                                                                          \
            std::memcpy(reinterpret_cast<char *>(&variable->m_Min), value.data(), value.size());   \
            std::memcpy(reinterpret_cast<char *>(&variable->m_Max), value.data(), value.size());   \
            std::memcpy(reinterpret_cast<char *>(&variable->m_Value), value.data(), value.size()); \
        }                                                                                          \
    }
                    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
                    else
                    {
                        helper::Log("Engine", "SscReaderNaive", "BeginStep", "unknown data type",
                                    m_ReaderRank, m_ReaderRank, 0, m_Verbosity, helper::FATALERROR);
                    }
                }
            }
        }
    }